

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_max_counter_bindings
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "It is a compile-time error to bind an atomic counter with a binding value greater than or equal to gl_MaxAtomicCounterBindings."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterateShaders(ctx,TESTCASE_LAYOUT_LARGE_BINDING);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_max_counter_bindings (NegativeTestContext& ctx)
{
	ctx.beginSection("It is a compile-time error to bind an atomic counter with a binding value greater than or equal to gl_MaxAtomicCounterBindings.");
	iterateShaders(ctx, TESTCASE_LAYOUT_LARGE_BINDING);
	ctx.endSection();
}